

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O3

void __thiscall features::Surf::create_response_map(Surf *this,int o,int k)

{
  undefined8 *puVar1;
  int iVar2;
  int fs;
  element_type *peVar3;
  float fVar4;
  int iVar5;
  Image<float> *__p;
  SatType SVar6;
  SatType SVar7;
  SatType SVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  pointer pfVar13;
  int x;
  int iVar14;
  int y;
  int iVar15;
  float fVar16;
  Ptr img;
  
  lVar12 = (long)o;
  iVar15 = 2 - (uint)(o == 0);
  uVar9 = 1;
  if (1 < (uint)o) {
    do {
      iVar15 = iVar15 * iVar15;
      uVar9 = uVar9 * 2;
    } while (uVar9 <= (uint)o >> 1);
  }
  iVar11 = o - uVar9;
  if (uVar9 <= (uint)o && iVar11 != 0) {
    do {
      iVar15 = iVar15 * 2;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  peVar3 = (this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar11 = (peVar3->super_TypedImageBase<long>).super_ImageBase.w;
  iVar2 = (peVar3->super_TypedImageBase<long>).super_ImageBase.h;
  iVar14 = iVar2;
  iVar10 = iVar11;
  if (0 < o) {
    do {
      iVar10 = iVar10 + 1 >> 1;
      iVar14 = iVar14 + 1 >> 1;
      o = o + -1;
    } while (o != 0);
  }
  fs = *(int *)((anonymous_namespace)::kernel_sizes + (long)k * 4 + lVar12 * 0x10);
  __p = (Image<float> *)operator_new(0x30);
  (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase =
       (_func_int **)&PTR__TypedImageBase_0014db58;
  (__p->super_TypedImageBase<float>).super_ImageBase.w = iVar10;
  (__p->super_TypedImageBase<float>).super_ImageBase.h = iVar14;
  (__p->super_TypedImageBase<float>).super_ImageBase.c = 1;
  std::vector<float,_std::allocator<float>_>::resize
            (&(__p->super_TypedImageBase<float>).data,(long)(iVar10 * iVar14));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<float>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&img,__p);
  if (0 < iVar2) {
    fVar4 = 1.0 / (float)((fs * 2 + -1) * fs);
    img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(fs / 2 + fs + 1);
    iVar10 = fs / 2 + fs;
    y = 0;
    iVar14 = 0;
    do {
      if (0 < iVar11) {
        iVar5 = (int)img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
        pfVar13 = (__p->super_TypedImageBase<float>).data.
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start + iVar14;
        x = 0;
        do {
          fVar16 = 0.0;
          if ((((iVar10 < y) && (iVar10 < x)) &&
              ((int)img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + x < iVar11)) && (iVar5 + y < iVar2)) {
            SVar6 = filter_dxx(this,fs,x,y);
            SVar7 = filter_dyy(this,fs,x,y);
            SVar8 = filter_dxy(this,fs,x,y);
            fVar16 = (float)SVar8 * fVar4 * -0.912 * (float)SVar8 * fVar4 +
                     (float)SVar7 * fVar4 * (float)SVar6 * fVar4;
          }
          *pfVar13 = fVar16;
          x = x + iVar15;
          pfVar13 = pfVar13 + 1;
          iVar14 = iVar14 + 1;
        } while (x < iVar11);
      }
      y = y + iVar15;
    } while (y < iVar2);
  }
  puVar1 = (undefined8 *)
           (*(long *)&(this->octaves).
                      super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar12].imgs.
                      super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                      ._M_impl + (long)k * 0x10);
  *puVar1 = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1),
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&img);
  if (img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void
Surf::create_response_map (int o, int k)
{
    /*
     * In order to create the Hessian response map for filter size 'fs',
     * we need to convolute the image with second order Gaussian partial
     * derivative filters Dxx, Dyy and Dxy and compute the response
     * as det(H) = Dxx * Dyy - w * Dxy * Dxy, where w = 0.81.
     * So we need to compute Dxx, Dyy and Dxy with filter size 'fs'.
     * Note: filter size 'fs' is defined as filter width / 3.
     * For details, see SURF 3.2.
     */
    typedef Octave::RespType RespType;

    /* Filter size. The actual kernel side length is 3 * fs. */
    int const fs = kernel_sizes[o][k];
    /* The sample spacing for the octaves. */
    int const step = math::fastpow(2, o);
    /* Weight to balance between real gaussian kernel and approximated one. */
    RespType const weight = 0.912;  // See SURF 3.3 (4).
    /* NormalizationKernel width is 3 * fs, height is 2 * fs - 1. */
    RespType const inv_karea = 1.0 / (fs * (2 * fs - 1));

    /* Original dimensions and octave dimensions. */
    int const w = this->sat->width();
    int const h = this->sat->height();
    int ow = w;
    int oh = h;
    for (int i = 0; i < o; ++i)
    {
        ow = (ow + 1) >> 1;
        oh = (oh + 1) >> 1;
    }

    /* Generate the response maps. */
    Octave::RespImage::Ptr img = Octave::RespImage::create(ow, oh, 1);
    int const border = fs + fs / 2 + 1;
    for (int y = 0, i = 0; y < h; y += step)
        for (int x = 0; x < w; x += step, ++i)
        {
            if (x < border || x + border >= w || y < border || y + border >= h)
            {
                img->at(i) = 0.0f;
                continue;
            }

            SatType dxx = this->filter_dxx(fs, x, y);
            SatType dyy = this->filter_dyy(fs, x, y);
            SatType dxy = this->filter_dxy(fs, x, y);
            RespType dxx_t = static_cast<RespType>(dxx) * inv_karea;
            RespType dyy_t = static_cast<RespType>(dyy) * inv_karea;
            RespType dxy_t = static_cast<RespType>(dxy) * inv_karea;
            /* Compute the determinant of the hessian. */
            img->at(i) = dxx_t * dyy_t - weight * dxy_t * dxy_t;
            /* The laplacian can be computed as dxx_t + dyy_t. */
            // float laplacian = dxx_t + dyy_t;
        }

    this->octaves[o].imgs[k] = img;
}